

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O1

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<pstore::indirect_string,pstore::indirect_string,std::equal_to<pstore::indirect_string>,void>
          (linear_node *this,undefined8 db,indirect_string *key)

{
  uint64_t uVar1;
  span<unsigned_char,__1L> sp;
  bool bVar2;
  index_pointer iVar3;
  unsigned_long uVar4;
  size_t __nbytes;
  long lVar5;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar6;
  indirect_string existing_key;
  type uninit_buffer;
  undefined8 local_78;
  undefined8 local_70;
  extent_type<_1L> in_stack_ffffffffffffff98;
  pointer in_stack_ffffffffffffffa0;
  database *local_48;
  pointer peStack_40;
  
  uVar1 = this->size_;
  uVar4 = 0xffffffffffffffff;
  if (uVar1 == 0) {
    iVar3.internal_ = (internal_node *)0x0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      local_70 = *(undefined8 *)((long)&this->leaves_[0].a_ + lVar5);
      sp.storage_.data_ = in_stack_ffffffffffffffa0;
      sp.storage_.super_extent_type<_1L>.size_ = in_stack_ffffffffffffff98.size_;
      local_78 = db;
      serialize::flood<_1l>(sp);
      serialize::serializer<pstore::indirect_string,_void>::read((int)&local_78,&local_48,__nbytes);
      in_stack_ffffffffffffff98.size_ = (index_type)local_48;
      in_stack_ffffffffffffffa0 = peStack_40;
      bVar2 = indirect_string::operator==((indirect_string *)&stack0xffffffffffffff98,key);
      if (bVar2) {
        iVar3 = (index_pointer)((index_pointer *)((long)&this->leaves_[0].a_ + lVar5))->internal_;
        goto LAB_00147d12;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar1 << 3 != lVar5);
    iVar3.internal_ = (internal_node *)0x0;
    uVar4 = 0xffffffffffffffff;
  }
LAB_00147d12:
  pVar6.second = uVar4;
  pVar6.first.internal_ = iVar3.internal_;
  return pVar6;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }